

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O0

void __thiscall ExpressionTemplateTest::constructionAndAssignmentTest(ExpressionTemplateTest *this)

{
  int iVar1;
  value_type vVar2;
  value_type vVar3;
  reference piVar4;
  BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
  local_1b8;
  bool local_199;
  ulong local_198;
  size_t x_1;
  size_t y_1;
  size_t z_1;
  BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Plus<int,_int,_int>_>
  local_168;
  bool local_149;
  ulong local_148;
  size_t x;
  size_t y;
  size_t z;
  BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Plus<int,_int,_int>_>
  local_128;
  undefined1 local_110 [8];
  Marray<int,_std::allocator<unsigned_long>_> r;
  undefined1 local_c0 [8];
  View<int,_false,_std::allocator<unsigned_long>_> w;
  allocator<int> local_69;
  undefined1 local_68 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v;
  size_t shape [3];
  ExpressionTemplateTest *this_local;
  
  v.geometry_.coordinateOrder_ = 2;
  v.geometry_.isSimple_ = false;
  v.geometry_._53_3_ = 0;
  shape[0] = 3;
  shape[1] = 2;
  shape[2] = (size_t)this;
  std::allocator<int>::allocator(&local_69);
  andres::View<int,false,std::allocator<unsigned_long>>::View<unsigned_long*>
            ((View<int,false,std::allocator<unsigned_long>> *)local_68,
             (unsigned_long *)&v.geometry_.coordinateOrder_,shape + 2,this->dataInt_,
             &andres::defaultOrder,&andres::defaultOrder,&local_69);
  std::allocator<int>::~allocator(&local_69);
  std::allocator<int>::allocator((allocator<int> *)&r.field_0x47);
  andres::View<int,false,std::allocator<unsigned_long>>::View<unsigned_long*>
            ((View<int,false,std::allocator<unsigned_long>> *)local_c0,
             (unsigned_long *)&v.geometry_.coordinateOrder_,shape + 2,this->dataInt_ + 2,
             &andres::defaultOrder,&andres::defaultOrder,(allocator_type *)&r.field_0x47);
  std::allocator<int>::~allocator((allocator<int> *)&r.field_0x47);
  andres::operator+(&local_128,
                    (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int> *
                    )local_68,
                    (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int> *
                    )local_c0);
  std::allocator<int>::allocator((allocator<int> *)((long)&z + 7));
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<andres::BinaryViewExpression<andres::View<int,false,std::allocator<unsigned_long>>,int,andres::View<int,false,std::allocator<unsigned_long>>,int,andres::marray_detail::Plus<int,int,int>>,int>
            ((Marray<int,std::allocator<unsigned_long>> *)local_110,
             (ViewExpression<andres::BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Plus<int,_int,_int>_>,_int>
              *)&local_128,(allocator<int> *)((long)&z + 7));
  std::allocator<int>::~allocator((allocator<int> *)((long)&z + 7));
  for (y = 0; y < 2; y = y + 1) {
    for (x = 0; x < 3; x = x + 1) {
      for (local_148 = 0; local_148 < 2; local_148 = local_148 + 1) {
        piVar4 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)local_110,local_148,x,y
                           );
        iVar1 = *piVar4;
        andres::operator+(&local_168,
                          (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int>
                           *)local_68,
                          (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int>
                           *)local_c0);
        vVar2 = andres::
                BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Plus<int,_int,_int>_>
                ::operator()(&local_168,local_148,x,y);
        local_149 = iVar1 == vVar2;
        test(&local_149);
      }
    }
  }
  andres::operator*((BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
                     *)&z_1,(ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int>
                             *)local_68,
                    (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int> *
                    )local_c0);
  andres::Marray<int,std::allocator<unsigned_long>>::operator=
            ((Marray<int,std::allocator<unsigned_long>> *)local_110,
             (ViewExpression<andres::BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int>
              *)&z_1);
  for (y_1 = 0; y_1 < 2; y_1 = y_1 + 1) {
    for (x_1 = 0; x_1 < 3; x_1 = x_1 + 1) {
      for (local_198 = 0; local_198 < 2; local_198 = local_198 + 1) {
        piVar4 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)local_110,local_198,x_1
                            ,y_1);
        iVar1 = *piVar4;
        andres::operator*(&local_1b8,
                          (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int>
                           *)local_68,
                          (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int>
                           *)local_c0);
        vVar3 = andres::
                BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
                ::operator()(&local_1b8,local_198,x_1,y_1);
        local_199 = iVar1 == vVar3;
        test(&local_199);
      }
    }
  }
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_110);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_c0);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_68);
  return;
}

Assistant:

void ExpressionTemplateTest::constructionAndAssignmentTest()
{
    // Marray
    {
        std::size_t shape[] = {2, 3, 2};
        andres::View<int> v(shape, shape+3, dataInt_);
        andres::View<int> w(shape, shape+3, dataInt_ + 2);
        andres::Marray<int> r(v + w); // construction
        for(std::size_t z=0; z<2; ++z) {
            for(std::size_t y=0; y<3; ++y) {
                for(std::size_t x=0; x<2; ++x) {
                    test( r(x,y,z) == (v + w)(x,y,z) );
                }
            }
        }
        r = v * w; // assignment
        for(std::size_t z=0; z<2; ++z) {
            for(std::size_t y=0; y<3; ++y) {
                for(std::size_t x=0; x<2; ++x) {
                    test( r(x,y,z) == (v * w)(x,y,z) );
                }
            }
        }
    }
}